

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

void ApplicativeHelper::getHeadAndArgs(TermList term,TermList *head,TermStack *args)

{
  uint64_t uVar1;
  TermList *pTVar2;
  bool bVar3;
  TermList local_30;
  
  if (args->_cursor != args->_stack) {
    args->_cursor = args->_stack;
  }
  local_30._content = term._content;
  bVar3 = Kernel::TermList::isApplication(&local_30);
  if (bVar3) {
    do {
      uVar1 = *(uint64_t *)
               (local_30._content + 0x10 +
               (ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) * 8);
      if (args->_cursor == args->_end) {
        ::Lib::Stack<Kernel::TermList>::expand(args);
      }
      pTVar2 = args->_cursor;
      pTVar2->_content = uVar1;
      args->_cursor = pTVar2 + 1;
      local_30._content =
           *(uint64_t *)
            (local_30._content + 0x18 + (ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) * 8)
      ;
      bVar3 = Kernel::TermList::isApplication(&local_30);
    } while (bVar3);
  }
  head->_content = (uint64_t)local_30;
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(TermList term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;

}